

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_vdpu382.c
# Opt level: O2

MPP_RET hal_avs2d_vdpu382_start(void *hal,HalTaskInfo *task)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  MppDev ctx;
  MPP_RET MVar4;
  MPP_RET MVar5;
  long *plVar6;
  void *__ptr;
  FILE *pFVar7;
  size_t __n;
  char *fmt;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  Avs2dHalCtx_t *p_hal;
  bool bVar12;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  MppBuffer local_70;
  char name [50];
  
  if ((avs2d_hal_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","In.","hal_avs2d_vdpu382_start");
  }
  if (hal == (void *)0x0) {
    MVar4 = MPP_ERR_INIT;
    if ((avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","input empty(%d).\n",(char *)0x0,0x36a);
    }
    goto LAB_001de49b;
  }
  if ((((ulong)(task->dec).flags & 0xc) != 0) && (*(int *)(*(long *)((long)hal + 8) + 0x30) == 0)) {
    MVar4 = MPP_NOK;
    goto LAB_001de49b;
  }
  lVar11 = *(long *)((long)hal + 0x5a8);
  if (*(int *)((long)hal + 0x5a0) == 0) {
    plVar6 = (long *)(lVar11 + 0x50);
  }
  else {
    plVar6 = (long *)((long)(task->dec).reg_index * 0x18 + lVar11 + 0x10);
  }
  pvVar3 = (void *)*plVar6;
  ctx = *(MppDev *)((long)hal + 0x40);
  *(int *)((long)hal + 0x5c0) = *(int *)((long)hal + 0x5c0) + 1;
  wr_cfg.size = 0x70;
  wr_cfg.offset = 0x20;
  wr_cfg.reg = pvVar3;
  MVar4 = mpp_dev_ioctl(ctx,4,&wr_cfg);
  if (MVar4 == MPP_OK) {
    pvVar1 = (void *)((long)pvVar3 + 0x70);
    wr_cfg.size = 0xc4;
    wr_cfg.offset = 0x100;
    wr_cfg.reg = pvVar1;
    MVar4 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar4 != MPP_OK) goto LAB_001de469;
    wr_cfg.size = 0x40;
    wr_cfg.offset = 0x200;
    wr_cfg.reg = (void *)((long)pvVar3 + 0x134);
    MVar4 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar4 != MPP_OK) goto LAB_001de469;
    wr_cfg.size = 0xa0;
    wr_cfg.offset = 0x280;
    wr_cfg.reg = (void *)((long)pvVar3 + 0x174);
    MVar4 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar4 != MPP_OK) goto LAB_001de469;
    pvVar2 = (void *)((long)pvVar3 + 0x24c);
    wr_cfg.size = 0x58;
    wr_cfg.offset = 0x400;
    wr_cfg.reg = pvVar2;
    MVar4 = mpp_dev_ioctl(ctx,4,&wr_cfg);
    if (MVar4 != MPP_OK) goto LAB_001de469;
    rd_cfg.size = 0x38;
    rd_cfg.offset = 0x380;
    rd_cfg.reg = (void *)((long)pvVar3 + 0x214);
    MVar4 = mpp_dev_ioctl(ctx,5,&rd_cfg);
    if (MVar4 == MPP_OK) {
      rd_cfg.size = 0xc4;
      rd_cfg.offset = 0x100;
      rd_cfg.reg = pvVar1;
      MVar4 = mpp_dev_ioctl(ctx,5,&rd_cfg);
      if (MVar4 == MPP_OK) {
        rd_cfg.size = 0x58;
        rd_cfg.offset = 0x400;
        rd_cfg.reg = pvVar2;
        MVar4 = mpp_dev_ioctl(ctx,5,&rd_cfg);
        if (MVar4 == MPP_OK) {
          if ((avs2d_hal_debug & 0x200) != 0) {
            memset((void *)(lVar11 + 0x284),0,0x458);
            rd_cfg.size = 0x458;
            rd_cfg.offset = 0;
            rd_cfg.reg = (void *)(lVar11 + 0x284);
            mpp_dev_ioctl(ctx,5,&rd_cfg);
          }
          vdpu382_set_rcbinfo(ctx,(Vdpu382RcbInfo *)(lVar11 + 0x20c));
          if ((avs2d_hal_debug >> 10 & 1) != 0) {
            local_70 = (MppBuffer)0x0;
            mpp_buf_slot_get_prop
                      (*(MppBufSlots *)((long)hal + 0x18),(task->dec).input,SLOT_BUFFER,&local_70);
            __ptr = mpp_buffer_get_ptr_with_caller(local_70,"hal_avs2d_vdpu382_dump_stream");
            snprintf(name,0x32,"/data/tmp/rkv_stream_in_%03d.bin",
                     (ulong)*(uint *)((long)hal + 0x5c0));
            pFVar7 = fopen(name,"wb");
            __n = mpp_packet_get_length((task->dec).input_packet);
            fwrite(__ptr,1,__n,pFVar7);
            fclose(pFVar7);
          }
          if ((avs2d_hal_debug >> 9 & 1) != 0) {
            snprintf(name,0x32,"/data/tmp/rkv_reg_write_%03d.txt",
                     (ulong)*(uint *)((long)hal + 0x5c0));
            pFVar7 = fopen(name,"w+");
            fprintf(pFVar7,"********Frame num %d\n",(ulong)*(uint *)((long)hal + 0x5c0));
            for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)uVar9,0);
            }
            for (lVar11 = 0; lVar11 != 0x1c; lVar11 = lVar11 + 1) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)((int)lVar11 + 8),
                      (ulong)*(uint *)((long)pvVar3 + lVar11 * 4));
            }
            iVar8 = 0x1f;
            iVar10 = 0;
            while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)(iVar10 + 0x21),0);
              iVar10 = iVar10 + 1;
            }
            for (lVar11 = 0; lVar11 != 0x31; lVar11 = lVar11 + 1) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)((uint)lVar11 | 0x40),
                      (ulong)*(uint *)((long)pvVar1 + lVar11 * 4));
            }
            iVar8 = 0xf;
            iVar10 = 0;
            while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)(iVar10 + 0x71),0);
              iVar10 = iVar10 + 1;
            }
            for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)((uint)lVar11 | 0x80),
                      (ulong)*(uint *)((long)pvVar3 + 0x134 + lVar11 * 4));
            }
            iVar8 = 0x11;
            iVar10 = 0;
            while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)(iVar10 + 0x8f),0);
              iVar10 = iVar10 + 1;
            }
            for (lVar11 = 0; lVar11 != 0x28; lVar11 = lVar11 + 1) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)((int)lVar11 + 0xa0),
                      (ulong)*(uint *)((long)pvVar3 + 0x174 + lVar11 * 4));
            }
            iVar8 = 0x1a;
            iVar10 = 0;
            while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)(iVar10 + 0xc6),0);
              iVar10 = iVar10 + 1;
            }
            for (lVar11 = 0; lVar11 != 0xe; lVar11 = lVar11 + 1) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)((uint)lVar11 | 0xe0),
                      (ulong)*(uint *)((long)pvVar3 + 0x214 + lVar11 * 4));
            }
            iVar8 = 0x12;
            iVar10 = 0;
            while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)(iVar10 + 0xee),0);
              iVar10 = iVar10 + 1;
            }
            for (lVar11 = 0; lVar11 != 0x16; lVar11 = lVar11 + 1) {
              fprintf(pFVar7,"Write reg[%03d] : 0x%08x\n",(ulong)((uint)lVar11 | 0x100),
                      (ulong)*(uint *)((long)pvVar2 + lVar11 * 4));
            }
            fclose(pFVar7);
          }
          MVar5 = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
          MVar4 = MPP_OK;
          if (MVar5 != MPP_OK) {
            _mpp_log_l(2,"hal_avs2d_vdpu382","send cmd failed %d\n","hal_avs2d_vdpu382_start",
                       (ulong)(uint)MVar5);
            MVar4 = MVar5;
          }
          goto LAB_001de49b;
        }
        goto LAB_001de469;
      }
    }
    fmt = "set register read failed %d\n";
  }
  else {
LAB_001de469:
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_avs2d_vdpu382",fmt,"hal_avs2d_vdpu382_start",(ulong)(uint)MVar4);
LAB_001de49b:
  if ((avs2d_hal_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","Out.","hal_avs2d_vdpu382_start");
  }
  return MVar4;
}

Assistant:

MPP_RET hal_avs2d_vdpu382_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    Vdpu382Avs2dRegSet *regs = NULL;
    Avs2dVdpu382RegCtx_t *reg_ctx;
    MppDev dev = NULL;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;

    AVS2D_HAL_TRACE("In.");
    INP_CHECK(ret, NULL == p_hal);

    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->cfg->base.disable_error) {
        ret = MPP_NOK;
        goto __RETURN;
    }

    reg_ctx = (Avs2dVdpu382RegCtx_t *)p_hal->reg_ctx;
    regs = p_hal->fast_mode ? reg_ctx->reg_buf[task->dec.reg_index].regs : reg_ctx->regs;
    dev = p_hal->dev;

    p_hal->frame_no++;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->common;
        wr_cfg.size = sizeof(regs->common);
        wr_cfg.offset = OFFSET_COMMON_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->avs2d_param;
        wr_cfg.size = sizeof(regs->avs2d_param);
        wr_cfg.offset = OFFSET_CODEC_PARAMS_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->common_addr;
        wr_cfg.size = sizeof(regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->avs2d_addr;
        wr_cfg.size = sizeof(regs->avs2d_addr);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->statistic;
        wr_cfg.size = sizeof(regs->statistic);
        wr_cfg.offset = OFFSET_STATISTIC_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->irq_status;
        rd_cfg.size = sizeof(regs->irq_status);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->avs2d_param;
        rd_cfg.size = sizeof(regs->avs2d_param);
        rd_cfg.offset = OFFSET_CODEC_PARAMS_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->statistic;
        rd_cfg.size = sizeof(regs->statistic);
        rd_cfg.offset = OFFSET_STATISTIC_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);

        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        if (avs2d_hal_debug & AVS2D_HAL_DBG_REG) {
            memset(reg_ctx->reg_out, 0, sizeof(reg_ctx->reg_out));
            rd_cfg.reg = reg_ctx->reg_out;
            rd_cfg.size = sizeof(reg_ctx->reg_out);
            rd_cfg.offset = 0;
            ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        }

        // rcb info for sram
        vdpu382_set_rcbinfo(dev, reg_ctx->rcb_info);

        if (avs2d_hal_debug & AVS2D_HAL_DBG_IN)
            hal_avs2d_vdpu382_dump_stream(hal, task);

        if (avs2d_hal_debug & AVS2D_HAL_DBG_REG)
            hal_avs2d_vdpu382_dump_reg_write(hal, regs);

        // send request to hardware
        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }

    } while (0);

__RETURN:
    AVS2D_HAL_TRACE("Out.");
    return ret;
}